

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boardtest.h
# Opt level: O1

void __thiscall test::BoardTest::SetUp(BoardTest *this)

{
  allocator<char> local_31;
  string local_30;
  
  std::ios::rdbuf((streambuf *)((long)&std::cout + *(long *)(std::cout + -0x18)));
  board::Board::INIT();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,board::Board::DEFAULT_FEN,&local_31);
  board::Board::parseFen(&this->pos,&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

virtual void SetUp()
    {
        UnitTest::SetUp();

        board::Board::INIT();
        pos.parseFen(board::Board::DEFAULT_FEN);
    }